

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O2

int __thiscall bdQueryManager::QuerySummary(bdQueryManager *this,bdNodeId *id,bdQuerySummary *query)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 uVar3;
  int iVar4;
  _List_node_base *p_Var5;
  
  p_Var5 = (_List_node_base *)&this->mLocalQueries;
  do {
    p_Var5 = (((_List_base<bdQuery_*,_std::allocator<bdQuery_*>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)&this->mLocalQueries) {
      return 0;
    }
    iVar4 = operator==((bdNodeId *)p_Var5[1]._M_next,id);
  } while (iVar4 == 0);
  puVar1 = &(p_Var5[1]._M_next)->_M_next;
  *(undefined4 *)((query->mId).data + 0x10) = *(undefined4 *)(puVar1 + 2);
  uVar3 = puVar1[1];
  *(undefined8 *)(query->mId).data = *puVar1;
  *(undefined8 *)((query->mId).data + 8) = uVar3;
  lVar2 = (long)p_Var5[1]._M_next;
  *(undefined4 *)((query->mLimit).super_bdNodeId.data + 0x10) = *(undefined4 *)(lVar2 + 0x24);
  uVar3 = *(undefined8 *)(lVar2 + 0x1c);
  *(undefined8 *)(query->mLimit).super_bdNodeId.data = *(undefined8 *)(lVar2 + 0x14);
  *(undefined8 *)((query->mLimit).super_bdNodeId.data + 8) = uVar3;
  lVar2 = (long)p_Var5[1]._M_next;
  query->mState = *(uint32_t *)(lVar2 + 0x28);
  query->mQueryTS = *(time_t *)(lVar2 + 0x30);
  uVar3 = *(undefined8 *)(lVar2 + 0x38);
  query->mQueryFlags = (int)uVar3;
  query->mSearchTime = (int)((ulong)uVar3 >> 0x20);
  std::
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::operator=(&(query->mClosest)._M_t,
              (_Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               *)(lVar2 + 0x48));
  std::
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::operator=(&(query->mPotentialPeers)._M_t,
              (_Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               *)((long)p_Var5[1]._M_next + 0x78));
  std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::operator=
            (&query->mProxiesUnknown,
             (list<bdPeer,_std::allocator<bdPeer>_> *)((long)p_Var5[1]._M_next + 0xb8));
  std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::operator=
            (&query->mProxiesFlagged,
             (list<bdPeer,_std::allocator<bdPeer>_> *)((long)p_Var5[1]._M_next + 0xd0));
  query->mQueryIdlePeerRetryPeriod = *(int32_t *)((long)p_Var5[1]._M_next + 0x40);
  return 1;
}

Assistant:

int bdQueryManager::QuerySummary(const bdNodeId *id, bdQuerySummary &query) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++) {
		if ((*it)->mId == *id) {
			query.mId = (*it)->mId;
			query.mLimit = (*it)->mLimit;
			query.mState = (*it)->mState;
			query.mQueryTS = (*it)->mQueryTS;
			query.mQueryFlags = (*it)->mQueryFlags;
			query.mSearchTime = (*it)->mSearchTime;
			query.mClosest = (*it)->mClosest;
			query.mPotentialPeers = (*it)->mPotentialPeers;
			query.mProxiesUnknown = (*it)->mProxiesUnknown;
			query.mProxiesFlagged = (*it)->mProxiesFlagged;
 			query.mQueryIdlePeerRetryPeriod = (*it)->mQueryIdlePeerRetryPeriod;

			return 1;
		}
	}
	return 0;
}